

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

bool __thiscall Environment::hasSymbol(Environment *this,Identifier *ident)

{
  bool bVar1;
  __type _Var2;
  reference ppVar3;
  pair<const_Symbol,_std::shared_ptr<Member>_> *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
  *__range1;
  Identifier *ident_local;
  Environment *this_local;
  
  __end1 = std::
           unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
           ::begin(&this->symbols);
  it = (pair<const_Symbol,_std::shared_ptr<Member>_> *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
       ::end(&this->symbols);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_true>
                         *)&it);
    if (!bVar1) {
      return false;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_false,_true>::
             operator*(&__end1);
    _Var2 = std::operator==(&(ppVar3->first).name,ident);
    if (_Var2) break;
    std::__detail::_Node_iterator<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_false,_true>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool Environment::hasSymbol(const Identifier& ident) {
    for(auto& it : symbols) {
        if(it.first.name == ident)
            return true;
    }
    return false;
}